

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall
wabt::AST::Construct(AST *this,ExprList *es,Index nresults,Index nparams,bool is_function_body)

{
  ulong *puVar1;
  iterator __position;
  pointer pNVar2;
  pointer puVar3;
  int iVar4;
  Index IVar5;
  ulong uVar6;
  ulong uVar7;
  Node *pNVar8;
  int iVar9;
  Index nargs;
  long lVar10;
  long lVar11;
  Expr *e;
  pointer pNVar12;
  int i;
  int iVar13;
  int iVar14;
  byte bVar15;
  pointer pNVar16;
  Arities AVar17;
  Node local_60;
  
  __position._M_current =
       (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->block_stack,__position,
               &this->cur_block_id);
  }
  else {
    *__position._M_current = this->cur_block_id;
    (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->cur_block_id =
       (ulong)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
       ((long)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->blocks_closed,false);
  uVar6 = (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar13 = this->value_stack_depth;
  iVar4 = iVar13 - nparams;
  e = es->first_;
  if (e != (Expr *)0x0) {
    bVar15 = 0;
    do {
      Construct(this,e);
      AVar17 = ModuleContext::GetExprArity(this->mc,e);
      iVar9 = this->value_stack_depth - AVar17.nargs;
      this->value_stack_depth = iVar9;
      if (iVar9 < iVar13) {
        iVar13 = iVar9;
      }
      bVar15 = AVar17.unreachable | bVar15;
      if (((bVar15 & 1) == 0) && (iVar9 < iVar4)) {
        __assert_fail("unreachable || value_stack_depth >= value_stack_depth_start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                      ,0xe8,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
      }
      uVar7 = AVar17._0_8_ >> 0x20;
      IVar5 = AVar17.nreturns;
      iVar9 = iVar9 + IVar5;
      this->value_stack_depth = iVar9;
      if (uVar7 == 1) {
        iVar13 = iVar13 + (uint)(iVar9 + -1 == iVar13 && e->type_ == Const);
      }
      else {
        iVar14 = iVar13 - iVar4;
        nargs = iVar9 - iVar13;
        if ((uVar7 == 0) && (iVar4 < iVar9)) {
          if ((int)nargs < 1) {
            pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            std::_V2::
            __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                      (pNVar16 + (-1 - (long)iVar14),pNVar16 + -1);
          }
          else {
            pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            iVar13 = 0;
            local_60.ntype = pNVar16[-1].ntype;
            local_60.etype = pNVar16[-1].etype;
            pNVar16[-1].ntype = Uninitialized;
            pNVar16[-1].etype = Nop;
            local_60.e = pNVar16[-1].e;
            local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start =
                 pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_60.children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            pNVar16[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_60.u = pNVar16[-1].u;
            pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_finish = pNVar16 + -1;
            std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&pNVar16[-1].children);
            pNVar8 = InsertNode(this,FlushToVars,Nop,(Expr *)0x0,nargs);
            (pNVar8->u).field_0.var_start = this->flushed_vars;
            (pNVar8->u).field_0.var_count = nargs;
            std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
                      (&this->exp_stack,&local_60);
            pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            std::_V2::
            __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                      (pNVar16 + (-2 - (long)iVar14),pNVar16 + -2);
            do {
              pNVar8 = InsertNode(this,FlushedVar,Nop,(Expr *)0x0,0);
              IVar5 = this->flushed_vars;
              this->flushed_vars = IVar5 + 1;
              (pNVar8->u).field_0.var_start = IVar5;
              (pNVar8->u).field_0.var_count = 1;
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)nargs);
            std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&local_60.children);
          }
        }
        else {
          if (uVar7 == 0) goto LAB_00151b75;
          if ((int)nargs < (int)IVar5) {
            __assert_fail("num_vals >= static_cast<int>(arity.nreturns)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                          ,299,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
          }
          pNVar8 = InsertNode(this,FlushToVars,Nop,(Expr *)0x0,(nargs - IVar5) + 1);
          (pNVar8->u).field_0.var_start = this->flushed_vars;
          (pNVar8->u).field_0.var_count = nargs;
          pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          std::_V2::
          __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                    (pNVar16 + (-1 - (long)iVar14),pNVar16 + -1);
          if (0 < (int)nargs) {
            iVar13 = 0;
            do {
              pNVar8 = InsertNode(this,FlushedVar,Nop,(Expr *)0x0,0);
              IVar5 = this->flushed_vars;
              this->flushed_vars = IVar5 + 1;
              (pNVar8->u).field_0.var_start = IVar5;
              (pNVar8->u).field_0.var_count = 1;
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)nargs);
          }
        }
        iVar13 = this->value_stack_depth;
        iVar9 = iVar13;
      }
LAB_00151b75:
      e = (e->super_intrusive_list_base<wabt::Expr>).next_;
    } while (e != (Expr *)0x0);
    iVar13 = iVar9;
    if ((bVar15 & 1) != 0) goto LAB_00151ba3;
  }
  if (iVar13 - iVar4 != nresults) {
    __assert_fail("unreachable || value_stack_depth - value_stack_depth_start == static_cast<int>(nresults)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                  ,0x142,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
LAB_00151ba3:
  this->value_stack_depth = iVar4;
  pNVar16 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar2 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)((long)pNVar2 - (long)pNVar16) < uVar6) {
    __assert_fail("end >= start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                  ,0x147,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
  lVar10 = (long)uVar6 >> 4;
  if (is_function_body) {
    if (pNVar16 != pNVar2) {
      if (pNVar2[-1].etype == Return) {
        if (pNVar2[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start ==
            pNVar2[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
          super__Vector_impl_data._M_finish = pNVar2 + -1;
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&pNVar2[-1].children);
        }
      }
      else if (nresults != 0) {
        InsertNode(this,EndReturn,Nop,(Expr *)0x0,nresults);
      }
    }
    pNVar16 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar6 = (long)(this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pNVar16;
    if (0 < (long)uVar6) {
      uVar6 = uVar6 / 0x30 + 1;
      do {
        std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
                  (&this->exp_stack,pNVar16);
        pNVar16 = pNVar16 + 1;
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
      uVar6 = (long)(this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
              ((this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
               .super__Vector_impl_data._M_start,
               (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                     _M_impl.super__Vector_impl_data._M_finish - uVar6);
    pNVar16 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar2 = (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar12 = pNVar16;
    if (pNVar2 != pNVar16) {
      do {
        std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&pNVar12->children);
        pNVar12 = pNVar12 + 1;
      } while (pNVar12 != pNVar2);
      (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = pNVar16;
    }
  }
  uVar6 = ((long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  lVar11 = uVar6 + lVar10 * 0x5555555555555555;
  if (uVar6 < (ulong)(lVar10 * -0x5555555555555555)) {
    __assert_fail("end >= start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                  ,0x161,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
  if (lVar11 != 1) {
    InsertNode(this,Statements,Nop,(Expr *)0x0,(Index)lVar11);
  }
  uVar6 = this->cur_block_id;
  uVar7 = uVar6 + 0x3f;
  if (-1 < (long)uVar6) {
    uVar7 = uVar6;
  }
  puVar1 = (this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar7 >> 6) +
           (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
  puVar3 = (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this->cur_block_id = puVar3[-1];
  (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + -1;
  return;
}

Assistant:

void Construct(const ExprList& es, Index nresults, Index nparams, bool is_function_body) {
    block_stack.push_back(cur_block_id);
    cur_block_id = blocks_closed.size();
    blocks_closed.push_back(false);
    auto start = exp_stack.size();
    int value_stack_depth_start = value_stack_depth - nparams;
    auto value_stack_in_variables = value_stack_depth;
    bool unreachable = false;
    for (auto& e : es) {
      Construct(e);
      auto arity = mc.GetExprArity(e);
      value_stack_depth -= arity.nargs;
      value_stack_in_variables = std::min(value_stack_in_variables,
                                          value_stack_depth);
      unreachable = unreachable || arity.unreachable;
      assert(unreachable || value_stack_depth >= value_stack_depth_start);
      value_stack_depth += arity.nreturns;
      // We maintain the invariant that a value_stack_depth of N is represented
      // by the last N exp_stack items (each of which returning exactly 1
      // value), all exp_stack items before it return void ("statements").
      // In particular for the wasm stack:
      // - The values between 0 and value_stack_depth_start are part of the
      //   parent block, and not touched here.
      // - The values from there up to value_stack_in_variables are variables
      //   to be used, representing previous statements that flushed the
      //   stack into variables.
      // - Values on top of that up to value_stack_depth are exps returning
      //   a single value.
      // The code below maintains the above invariants. With this in place
      // code "falls into place" the way you expect it.
      if (arity.nreturns != 1) {
        auto num_vars = value_stack_in_variables - value_stack_depth_start;
        auto num_vals = value_stack_depth - value_stack_in_variables;
        auto GenFlushVars = [&](int nargs) {
          auto& ftv = InsertNode(NodeType::FlushToVars, ExprType::Nop, nullptr,
                                 nargs);
          ftv.u.var_start = flushed_vars;
          ftv.u.var_count = num_vals;
        };
        auto MoveStatementsBelowVars = [&](size_t amount) {
          std::rotate(exp_stack.end() - num_vars - amount,
                      exp_stack.end() - amount,
                      exp_stack.end());
        };
        auto GenFlushedVars = [&]() {
          // Re-generate these values as vars.
          for (int i = 0; i < num_vals; i++) {
            auto& fv = InsertNode(NodeType::FlushedVar, ExprType::Nop, nullptr,
                                  0);
            fv.u.var_start = flushed_vars++;
            fv.u.var_count = 1;
          }
        };
        if (arity.nreturns == 0 &&
            value_stack_depth > value_stack_depth_start) {
          // We have a void item on top of the exp_stack, so we must "lift" the
          // previous values around it.
          // We track what part of the stack is in variables to avoid doing
          // this unnecessarily.
          if (num_vals > 0) {
            // We have actual new values that need lifting.
            // This puts the part of the stack that wasn't already a variable
            // (before the current void exp) into a FlushToVars.
            auto void_exp = std::move(exp_stack.back());
            exp_stack.pop_back();
            GenFlushVars(num_vals);
            exp_stack.push_back(std::move(void_exp));
            // Put this flush statement + void statement before any
            // existing variables.
            MoveStatementsBelowVars(2);
            // Now re-generate these values after the void exp as vars.
            GenFlushedVars();
          } else {
            // We have existing variables that need lifting, but no need to
            // create them anew.
            std::rotate(exp_stack.end() - num_vars - 1, exp_stack.end() - 1,
                        exp_stack.end());
          }
          value_stack_in_variables = value_stack_depth;
        } else if (arity.nreturns > 1) {
          // Multivalue: we flush the stack also.
          // Number of other non-variable values that may be present:
          assert(num_vals >= static_cast<int>(arity.nreturns));
          // Flush multi-value exp + others.
          GenFlushVars(num_vals - arity.nreturns + 1);
          // Put this flush statement before any existing variables.
          MoveStatementsBelowVars(1);
          GenFlushedVars();
          value_stack_in_variables = value_stack_depth;
        }
      } else {
        // Special optimisation: for constant instructions, we can mark these
        // as if they were variables, so they can be re-ordered for free with
        // the above code, without needing new variables!
        // TODO: this would be nice to also do for get_local and maybe others,
        // though that needs a way to ensure there's no set_local in between
        // when they get lifted, so complicates matters a bit.
        if (e.type() == ExprType::Const &&
            value_stack_in_variables == value_stack_depth - 1) {
          value_stack_in_variables++;
        }
      }
    }
    assert(unreachable ||
           value_stack_depth - value_stack_depth_start ==
           static_cast<int>(nresults));
    // Undo any changes to value_stack_depth, since parent takes care of arity
    // changes.
    value_stack_depth = value_stack_depth_start;
    auto end = exp_stack.size();
    assert(end >= start);
    if (is_function_body) {
      if (!exp_stack.empty()) {
        if (exp_stack.back().etype == ExprType::Return) {
          if (exp_stack.back().children.empty()) {
            // Return statement at the end of a void function.
            exp_stack.pop_back();
          }
        } else if (nresults) {
          // Combine nresults into a return statement, for when this is used as
          // a function body.
          // TODO: if this is some other kind of block and >1 value is being
          // returned, probably need some kind of syntax to make that clearer.
          InsertNode(NodeType::EndReturn, ExprType::Nop, nullptr, nresults);
        }
      }
      // TODO: these predecls are always at top level, but in the case of
      // use inside an exp, it be nice to do it in the current block. Can't
      // do that for predecls that are "out if scope" however.
      std::move(predecls.begin(), predecls.end(),
                std::back_inserter(exp_stack));
      std::rotate(exp_stack.begin(), exp_stack.end() - predecls.size(),
                  exp_stack.end());
      predecls.clear();
    }
    end = exp_stack.size();
    assert(end >= start);
    auto size = end - start;
    if (size != 1) {
      InsertNode(NodeType::Statements, ExprType::Nop, nullptr, size);
    }
    blocks_closed[cur_block_id] = true;
    cur_block_id = block_stack.back();
    block_stack.pop_back();
  }